

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

const_iterator __thiscall
pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator::operator+
          (const_iterator *this,uint x)

{
  const_iterator cVar1;
  const_iterator result;
  uint local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_18 = this->bitmap_;
  uStack_14 = *(undefined4 *)&this->field_0x4;
  uStack_10 = (undefined4)this->pos_;
  uStack_c = *(undefined4 *)((long)&this->pos_ + 4);
  std::__advance<pstore::sparse_array<unsigned_long,unsigned_int>::indices::const_iterator,long>
            (&local_18,x);
  cVar1._4_4_ = 0;
  cVar1.bitmap_ = local_18;
  cVar1.pos_._4_4_ = uStack_c;
  cVar1.pos_._0_4_ = uStack_10;
  return cVar1;
}

Assistant:

const_iterator operator+ (unsigned x) const {
                    auto result = *this;
                    std::advance (result, x);
                    return result;
                }